

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

int __thiscall FStateDefinitions::GetStateLabelIndex(FStateDefinitions *this,FName *statename)

{
  FState *pFVar1;
  uint uVar2;
  FName local_2c;
  FStateDefine *local_28;
  FStateDefine *std;
  FName *statename_local;
  FStateDefinitions *this_local;
  
  std = (FStateDefine *)statename;
  statename_local = (FName *)this;
  FName::FName(&local_2c,statename);
  local_28 = FindStateLabelInList(&this->StateLabels,&local_2c,false);
  if (local_28 == (FStateDefine *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    pFVar1 = local_28->State;
    uVar2 = TArray<FState,_FState>::Size(&this->StateArray);
    if ((FState *)(ulong)(uVar2 + 1) < pFVar1) {
      __assert_fail("(size_t)std->State <= StateArray.Size() + 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_states.cpp"
                    ,0x1a2,"int FStateDefinitions::GetStateLabelIndex(FName)");
    }
    this_local._4_4_ = (int)local_28->State + -1;
  }
  return this_local._4_4_;
}

Assistant:

int FStateDefinitions::GetStateLabelIndex (FName statename)
{
	FStateDefine *std = FindStateLabelInList(StateLabels, statename, false);
	if (std == NULL)
	{
		return -1;
	}
	assert((size_t)std->State <= StateArray.Size() + 1);
	return (int)((ptrdiff_t)std->State - 1);
}